

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode hostname_check(Curl_URL *u,char *hostname,size_t hlen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char cVar9;
  char *__s;
  CURLUcode CVar10;
  CURLUcode CVar11;
  char *pcVar12;
  bool bVar13;
  char zoneid [16];
  char dest [16];
  char local_78 [48];
  undefined1 local_48 [24];
  
  if (*hostname == '\0') {
    return CURLUE_NO_HOST;
  }
  if (*hostname != '[') {
    sVar7 = strcspn(hostname," \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if (sVar7 == hlen) {
      return CURLUE_OK;
    }
    return CURLUE_BAD_HOSTNAME;
  }
  CVar10 = CURLUE_BAD_IPV6;
  if ((3 < hlen) && (hostname[hlen - 1] == ']')) {
    __s = hostname + 1;
    sVar5 = strspn(__s,"0123456789abcdefABCDEF:.");
    sVar7 = hlen - 2;
    if (hlen - 2 == sVar5) {
LAB_0054875d:
      __s[sVar7] = '\0';
      iVar3 = inet_pton(10,__s,local_48);
      bVar13 = iVar3 == 1;
      CVar11 = CURLUE_BAD_IPV6;
      if (bVar13) {
        pcVar6 = inet_ntop(10,local_48,local_78,0x2e);
        if ((pcVar6 != (char *)0x0) && (sVar5 = strlen(local_78), sVar5 < sVar7)) {
          strcpy(__s,local_78);
          sVar7 = strlen(local_78);
          hostname[sVar7 + 2] = '\0';
        }
        __s[sVar7] = ']';
        CVar11 = CVar10;
      }
      goto LAB_005488c5;
    }
    if (__s[sVar5] == '%') {
      pcVar12 = __s + sVar5;
      pcVar6 = pcVar12 + 1;
      iVar3 = strncmp(pcVar6,"25",2);
      if (((iVar3 == 0) && (pcVar12[3] != '\0')) && (pcVar12[3] != ']')) {
        pcVar6 = pcVar12 + 3;
      }
      cVar9 = *pcVar6;
      uVar4 = 0;
      uVar8 = 0;
      if (cVar9 == '\0') {
        bVar13 = false;
      }
      else {
        do {
          if ((cVar9 == ']') || (0xe < uVar8)) goto LAB_0054885c;
          uVar1 = uVar8 + 1;
          local_78[uVar8] = cVar9;
          cVar9 = pcVar6[uVar8 + 1];
          uVar8 = uVar1;
        } while (cVar9 != '\0');
        uVar8 = uVar1 & 0xffffffff;
LAB_0054885c:
        uVar4 = (uint)uVar8;
        bVar13 = cVar9 == ']';
      }
      bVar2 = false;
      CVar10 = CURLUE_MALFORMED_INPUT;
      if ((uVar4 != 0) && (bVar13)) {
        local_78[uVar4] = '\0';
        pcVar6 = (*Curl_cstrdup)(local_78);
        u->zoneid = pcVar6;
        if (pcVar6 == (char *)0x0) {
          CVar10 = CURLUE_OUT_OF_MEMORY;
          bVar2 = false;
        }
        else {
          pcVar12[0] = ']';
          pcVar12[1] = '\0';
          bVar2 = true;
        }
      }
      sVar7 = sVar5;
      if (bVar2) goto LAB_0054875d;
    }
  }
  bVar13 = false;
  CVar11 = CVar10;
LAB_005488c5:
  if (bVar13) {
    return CURLUE_OK;
  }
  return CVar11;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname,
                                size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(hostname);

  if(!hostname[0])
    return CURLUE_NO_HOST;
  else if(hostname[0] == '[') {
    const char *l = "0123456789abcdefABCDEF:.";
    if(hlen < 4) /* '[::]' is the shortest possible valid string */
      return CURLUE_BAD_IPV6;
    hostname++;
    hlen -= 2;

    if(hostname[hlen] != ']')
      return CURLUE_BAD_IPV6;

    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      hlen = len;
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          /* impossible to reach? */
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_BAD_IPV6;
      /* hostname is fine */
    }
#ifdef ENABLE_IPV6
    {
      char dest[16]; /* fits a binary IPv6 address */
      char norm[MAX_IPADR_LEN];
      hostname[hlen] = 0; /* end the address there */
      if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
        return CURLUE_BAD_IPV6;

      /* check if it can be done shorter */
      if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
         (strlen(norm) < hlen)) {
        strcpy(hostname, norm);
        hlen = strlen(norm);
        hostname[hlen + 1] = 0;
      }
      hostname[hlen] = ']'; /* restore ending bracket */
    }
#endif
  }
  else {
    /* letters from the second string are not ok */
    len = strcspn(hostname, " \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
  }
  return CURLUE_OK;
}